

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pmx.h
# Opt level: O0

void __thiscall pmx::PmxSetting::PmxSetting(PmxSetting *this)

{
  PmxSetting *this_local;
  
  this->encoding = '\0';
  this->uv = '\0';
  this->vertex_index_size = '\0';
  this->texture_index_size = '\0';
  this->material_index_size = '\0';
  this->bone_index_size = '\0';
  this->morph_index_size = '\0';
  this->rigidbody_index_size = '\0';
  return;
}

Assistant:

PmxSetting()
			: encoding(0)
			, uv(0)
			, vertex_index_size(0)
			, texture_index_size(0)
			, material_index_size(0)
			, bone_index_size(0)
			, morph_index_size(0)
			, rigidbody_index_size(0)
		{}